

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doomtype.h
# Opt level: O3

bool AM_addMark(void)

{
  FTextureID FVar1;
  double dVar2;
  
  FVar1.texnum = marknums[0].texnum;
  if (0 < marknums[0].texnum) {
    dVar2 = m_y + m_h * 0.5;
    markpoints[markpointnum].x = m_x + m_w * 0.5;
    markpoints[markpointnum].y = dVar2;
    markpointnum = (markpointnum + 1) % 10;
  }
  return 0 < FVar1.texnum;
}

Assistant:

bool isValid() const { return texnum > 0; }